

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.h
# Opt level: O0

void __thiscall
dynamicgraph::SignalPtr<double,_int>::setReference(SignalPtr<double,_int> *this,double *t,Mutex *m)

{
  Mutex *m_local;
  double *t_local;
  SignalPtr<double,_int> *this_local;
  
  (*this->_vptr_SignalPtr[2])
            (this,(_func_int *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
  Signal<double,_int>::setReference
            ((Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3])
             ,t,m);
  return;
}

Assistant:

virtual void setReference(const T *t,
                            typename Signal<T, Time>::Mutex *m = NULL) {
    plug(this);
    Signal<T, Time>::setReference(t, m);
  }